

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorRasterizerTests.cpp
# Opt level: O2

void __thiscall
agge::tests::VectorRasterizerTests::SubPixelLineExpandsMargins(VectorRasterizerTests *this)

{
  allocator local_151;
  int local_150;
  int local_14c;
  string local_148;
  LocationInfo local_128;
  vector_rasterizer vr1;
  vector_rasterizer vr2;
  
  vector_rasterizer::vector_rasterizer(&vr1);
  vector_rasterizer::vector_rasterizer(&vr2);
  vector_rasterizer::line(&vr1,0xd00,0x1100,0xd80,0x11b3);
  vector_rasterizer::line(&vr2,-0x171a,-0x2500,-0x1800,-0x24b3);
  local_150 = 1;
  local_14c = 0;
  if (vr1._min_y <= vr1._max_y) {
    local_14c = (vr1._max_x - vr1._min_x) + 1;
  }
  std::__cxx11::string::string
            ((string *)&local_148,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,&local_151);
  ut::LocationInfo::LocationInfo(&local_128,&local_148,0x57);
  ut::are_equal<int,int>(&local_150,&local_14c,&local_128);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_150 = 0x11;
  local_14c = vr1._min_y;
  std::__cxx11::string::string
            ((string *)&local_148,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,&local_151);
  ut::LocationInfo::LocationInfo(&local_128,&local_148,0x58);
  ut::are_equal<int,int>(&local_150,&local_14c,&local_128);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_150 = 1;
  local_14c = (vr1._max_y - vr1._min_y) + 1;
  if (vr1._max_y < vr1._min_y) {
    local_14c = 0;
  }
  std::__cxx11::string::string
            ((string *)&local_148,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,&local_151);
  ut::LocationInfo::LocationInfo(&local_128,&local_148,0x59);
  ut::are_equal<int,int>(&local_150,&local_14c,&local_128);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string
            ((string *)&local_148,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,(allocator *)&local_150);
  ut::LocationInfo::LocationInfo(&local_128,&local_148,0x5a);
  ut::is_false(vr1._max_y < vr1._min_y,&local_128);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_150 = 1;
  local_14c = 0;
  if (vr2._min_y <= vr2._max_y) {
    local_14c = (vr2._max_x - vr2._min_x) + 1;
  }
  std::__cxx11::string::string
            ((string *)&local_148,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,&local_151);
  ut::LocationInfo::LocationInfo(&local_128,&local_148,0x5c);
  ut::are_equal<int,int>(&local_150,&local_14c,&local_128);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_150 = -0x25;
  local_14c = vr2._min_y;
  std::__cxx11::string::string
            ((string *)&local_148,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,&local_151);
  ut::LocationInfo::LocationInfo(&local_128,&local_148,0x5d);
  ut::are_equal<int,int>(&local_150,&local_14c,&local_128);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_150 = 1;
  local_14c = (vr2._max_y - vr2._min_y) + 1;
  if (vr2._max_y < vr2._min_y) {
    local_14c = 0;
  }
  std::__cxx11::string::string
            ((string *)&local_148,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,&local_151);
  ut::LocationInfo::LocationInfo(&local_128,&local_148,0x5e);
  ut::are_equal<int,int>(&local_150,&local_14c,&local_128);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  vector_rasterizer::~vector_rasterizer(&vr2);
  vector_rasterizer::~vector_rasterizer(&vr1);
  return;
}

Assistant:

test( SubPixelLineExpandsMargins )
			{
				// INIT
				vector_rasterizer vr1, vr2;

				// ACT
				vr1.line(fp(13.0), fp(17.0), fp(13.5), fp(17.7));
				vr2.line(fp(-23.1), fp(-37.0), fp(-24.0), fp(-36.7));

				// ACT / ASSERT
				assert_equal(1, vr1.width());
				assert_equal(17, vr1.min_y());
				assert_equal(1, vr1.height());
				assert_is_false(vr1.empty());

				assert_equal(1, vr2.width());
				assert_equal(-37, vr2.min_y());
				assert_equal(1, vr2.height());
			}